

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *targetDir,string *dependFile,
          string *internalDependFile,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  pointer pcVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  Encoding EVar6;
  int iVar7;
  string *psVar8;
  char *pcVar9;
  cmDependsC *this_01;
  pointer lang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  cmGeneratedFileStream ruleFileStream;
  cmGeneratedFileStream internalRuleFileStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *local_4e8;
  string local_4e0;
  undefined1 local_4c0 [32];
  byte abStack_4a0 [552];
  undefined1 local_278 [584];
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_4e8 = validDeps;
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  pcVar1 = local_4c0 + 0x10;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  local_4c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4c0,pcVar2,pcVar2 + psVar8->_M_string_length);
  std::__cxx11::string::append((char *)local_4c0);
  std::__cxx11::string::append(local_4c0);
  bVar4 = cmMakefile::ReadListFile(this_00,(string *)local_4c0);
  if (bVar4) {
    if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)) {
      bVar5 = cmSystemTools::GetInterruptFlag();
      bVar4 = true;
      if (bVar5) goto LAB_002df917;
    }
    else {
LAB_002df917:
      bVar4 = false;
    }
    if ((pointer)local_4c0._0_8_ != pcVar1) {
      operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
    }
    if (bVar4) {
      local_4c0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4c0,"CMAKE_FORCE_UNIX_PATHS","");
      pcVar9 = cmMakefile::GetDefinition(this_00,(string *)local_4c0);
      if ((pointer)local_4c0._0_8_ != pcVar1) {
        operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
      }
      if ((pcVar9 != (char *)0x0) && (bVar4 = cmSystemTools::IsOff(pcVar9), !bVar4)) {
        cmSystemTools::s_ForceUnixPaths = true;
      }
      local_4c0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4c0,"CMAKE_RELATIVE_PATH_TOP_SOURCE","");
      pcVar9 = cmMakefile::GetDefinition(this_00,(string *)local_4c0);
      if ((pointer)local_4c0._0_8_ != pcVar1) {
        operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
      }
      if (pcVar9 != (char *)0x0) {
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)local_4c0,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
        cmStateDirectory::SetRelativePathTopSource((cmStateDirectory *)local_4c0,pcVar9);
      }
      local_4c0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4c0,"CMAKE_RELATIVE_PATH_TOP_BINARY","");
      pcVar9 = cmMakefile::GetDefinition(this_00,(string *)local_4c0);
      if ((pointer)local_4c0._0_8_ != pcVar1) {
        operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
      }
      if (pcVar9 != (char *)0x0) {
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)local_4c0,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
        cmStateDirectory::SetRelativePathTopBinary((cmStateDirectory *)local_4c0,pcVar9);
      }
      goto LAB_002dfa91;
    }
  }
  else if ((pointer)local_4c0._0_8_ != pcVar1) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  cmSystemTools::Error("Directory Information file not found",(char *)0x0,(char *)0x0,(char *)0x0);
LAB_002dfa91:
  EVar6 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_4c0,dependFile,false,EVar6);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_4c0,true);
  if ((abStack_4a0[*(long *)(local_4c0._0_8_ + -0x18)] & 5) == 0) {
    EVar6 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,internalDependFile,false,EVar6);
    bVar4 = ((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0;
    if (bVar4) {
      WriteDisclaimer(this,(ostream *)local_4c0);
      WriteDisclaimer(this,(ostream *)local_278);
      local_508.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_508.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_508.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4e0,"CMAKE_DEPENDS_LANGUAGES","");
      psVar8 = cmMakefile::GetSafeDefinition(this_00,&local_4e0);
      cmSystemTools::ExpandListArgument(psVar8,&local_508,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
      pbVar3 = local_508.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_508.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_508.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lang = local_508.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar7 = std::__cxx11::string::compare((char *)lang);
          if ((((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0))
              || (iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0)) ||
             ((iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0 ||
              (iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0)))) {
            this_01 = (cmDependsC *)operator_new(0x588);
            cmDependsC::cmDependsC(this_01,(cmLocalGenerator *)this,targetDir,lang,local_4e8);
LAB_002dfc79:
            (this_01->super_cmDepends).LocalGenerator = (cmLocalGenerator *)this;
            (this_01->super_cmDepends).FileTimeCache =
                 ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                 CMakeInstance->FileTimeCache;
            std::__cxx11::string::_M_assign((string *)&(this_01->super_cmDepends).Language);
            std::__cxx11::string::_M_assign((string *)&(this_01->super_cmDepends).TargetDirectory);
            cmDepends::Write(&this_01->super_cmDepends,(ostream *)local_4c0,(ostream *)local_278);
            (*(this_01->super_cmDepends)._vptr_cmDepends[1])(this_01);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)lang);
            if (iVar7 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c0,"# Note that incremental build could trigger ",0x2c);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c0,"a call to cmake_copy_f90_mod on each re-build\n",0x2e
                        );
              this_01 = (cmDependsC *)operator_new(0x148);
              cmDependsFortran::cmDependsFortran
                        ((cmDependsFortran *)this_01,(cmLocalGenerator *)this);
              goto LAB_002dfc79;
            }
            iVar7 = std::__cxx11::string::compare((char *)lang);
            if (iVar7 == 0) {
              this_01 = (cmDependsC *)operator_new(0x90);
              cmDependsJava::cmDependsJava((cmDependsJava *)this_01);
              goto LAB_002dfc79;
            }
          }
          lang = lang + 1;
        } while (lang != pbVar3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_508);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  }
  else {
    bVar4 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
  return bVar4;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  std::string const& targetDir, std::string const& dependFile,
  std::string const& internalDependFile,
  std::map<std::string, cmDepends::DependencyVector>& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  {
    std::string dirInfoFile = this->GetCurrentBinaryDirectory();
    dirInfoFile += "/CMakeFiles";
    dirInfoFile += "/CMakeDirectoryInformation.cmake";
    if (mf->ReadListFile(dirInfoFile) &&
        !cmSystemTools::GetErrorOccuredFlag()) {
      haveDirectoryInfo = true;
    }
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (const char* force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmSystemTools::IsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    if (const char* relativePathTopSource =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopSource(
        relativePathTopSource);
    }
    if (const char* relativePathTopBinary =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopBinary(
        relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  cmGeneratedFileStream ruleFileStream(
    dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  cmGeneratedFileStream internalRuleFileStream(
    internalDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  std::vector<std::string> langs;
  cmSystemTools::ExpandListArgument(
    mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES"), langs);
  for (std::string const& lang : langs) {
    // construct the checker
    // Create the scanner for this language
    std::unique_ptr<cmDepends> scanner;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "CUDA") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = cm::make_unique<cmDependsC>(this, targetDir, lang, &validDeps);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
    else if (lang == "Fortran") {
      ruleFileStream << "# Note that incremental build could trigger "
                     << "a call to cmake_copy_f90_mod on each re-build\n";
      scanner = cm::make_unique<cmDependsFortran>(this);
    } else if (lang == "Java") {
      scanner = cm::make_unique<cmDependsJava>();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileTimeCache(
        this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(targetDir);
      scanner->Write(ruleFileStream, internalRuleFileStream);
    }
  }

  return true;
}